

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_check_termination(OSQPWorkspace *work,c_int check_termination_new)

{
  char *in_RSI;
  long in_RDI;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_RSI);
  }
  else if ((long)in_RSI < 0) {
    printf("ERROR in %s: ","osqp_update_check_termination");
    printf("check_termination should be nonnegative");
    printf("\n");
    local_8 = 1;
  }
  else {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x98) = in_RSI;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_update_check_termination(OSQPWorkspace *work, c_int check_termination_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that check_termination is nonnegative
  if (check_termination_new < 0) {
#ifdef PRINTING
    c_eprint("check_termination should be nonnegative");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update check_termination
  work->settings->check_termination = check_termination_new;

  return 0;
}